

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

void upb_MtDecoder_PushOneof(upb_MtDecoder *d,upb_LayoutItem item)

{
  ulong uVar1;
  uint uVar2;
  upb_LayoutItem item_00;
  upb_LayoutItem item_01;
  
  if (item.field_index != 0xffff) {
    uVar2 = item._0_4_ + 0xfffd & 0xffff;
    item_00._0_8_ = item._0_8_ & 0xffffffffffff0000 | (ulong)uVar2;
    item_00.type = kUpb_LayoutItemType_OneofField;
    upb_MtDecoder_PushItem(d,item_00);
    uVar1 = (ulong)(item._0_4_ & 0xffff0000 | uVar2) | 0x100000000;
    item_01.type = kUpb_LayoutItemType_OneofCase;
    item_01.field_index = (short)uVar1;
    item_01.offset = (short)(uVar1 >> 0x10);
    item_01.rep = (int)(uVar1 >> 0x20);
    upb_MtDecoder_PushItem(d,item_01);
    return;
  }
  upb_MdDecoder_ErrorJmp
            (&d->base,"Empty oneof",CONCAT44((int)((ulong)register0x00000010 >> 0x20),item.type));
}

Assistant:

static void upb_MtDecoder_PushOneof(upb_MtDecoder* d, upb_LayoutItem item) {
  if (item.field_index == kUpb_LayoutItem_IndexSentinel) {
    upb_MdDecoder_ErrorJmp(&d->base, "Empty oneof");
  }
  item.field_index -= kOneofBase;

  // Push oneof data.
  item.type = kUpb_LayoutItemType_OneofField;
  upb_MtDecoder_PushItem(d, item);

  // Push oneof case.
  item.rep = kUpb_FieldRep_4Byte;  // Field Number.
  item.type = kUpb_LayoutItemType_OneofCase;
  upb_MtDecoder_PushItem(d, item);
}